

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::OneofMessage::GenerateCopyConstructorCode
          (OneofMessage *this,Printer *p)

{
  Printer *pPVar1;
  LogMessage *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  byte local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [23];
  Voidify local_19;
  Printer *local_18;
  Printer *p_local;
  OneofMessage *this_local;
  
  local_41 = 0;
  local_18 = p;
  p_local = (Printer *)this;
  if (((this->super_SingularMessage).has_hasbit_ & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,"!has_hasbit_");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/field_generators/message_field.cc"
               ,0x282,local_40._M_len,local_40._M_str);
    local_41 = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_30);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_19,pLVar2);
  }
  pPVar1 = local_18;
  if ((local_41 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,
             "\n    if (from._internal_has_$name$()) {\n      _this->$field_$ =\n          $superclass$::CopyConstruct<$Submsg$>(arena, *from.$field_$);\n    }\n  "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit(pPVar1,local_58._M_len,local_58._M_str);
  return;
}

Assistant:

void OneofMessage::GenerateCopyConstructorCode(io::Printer* p) const {
  ABSL_CHECK(!has_hasbit_);
  p->Emit(R"cc(
    if (from._internal_has_$name$()) {
      _this->$field_$ =
          $superclass$::CopyConstruct<$Submsg$>(arena, *from.$field_$);
    }
  )cc");
}